

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

void __thiscall kj::anon_unknown_123::AsyncPipe::shutdownWrite(AsyncPipe *this)

{
  AsyncCapabilityStream *pAVar1;
  Own<kj::(anonymous_namespace)::AsyncPipe::ShutdownedWrite,_std::nullptr_t> local_28;
  Own<kj::AsyncCapabilityStream,_std::nullptr_t> local_18;
  
  pAVar1 = (this->state).ptr;
  if (pAVar1 != (AsyncCapabilityStream *)0x0) {
    (*(pAVar1->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream[6])();
    return;
  }
  local_18.ptr = (AsyncCapabilityStream *)operator_new(0x10);
  ((local_18.ptr)->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
       (_func_int **)&PTR_read_006750a0;
  ((local_18.ptr)->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream =
       (_func_int **)&PTR_write_00675160;
  local_28.disposer =
       (Disposer *)
       &kj::_::HeapDisposer<kj::(anonymous_namespace)::AsyncPipe::ShutdownedWrite>::instance;
  local_18.disposer =
       (Disposer *)
       &kj::_::HeapDisposer<kj::(anonymous_namespace)::AsyncPipe::ShutdownedWrite>::instance;
  local_28.ptr = (ShutdownedWrite *)0x0;
  Own<kj::AsyncCapabilityStream,_std::nullptr_t>::operator=(&this->ownState,&local_18);
  Own<kj::AsyncCapabilityStream,_std::nullptr_t>::dispose(&local_18);
  Own<kj::(anonymous_namespace)::AsyncPipe::ShutdownedWrite,_std::nullptr_t>::~Own(&local_28);
  (this->state).ptr = (this->ownState).ptr;
  return;
}

Assistant:

void shutdownWrite() override {
    KJ_IF_SOME(s, state) {
      s.shutdownWrite();
    } else {
      ownState = kj::heap<ShutdownedWrite>();
      state = *ownState;
    }